

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysp_node_notif * lysp_node_notifs(lysp_node *node)

{
  lysp_node_notif **pplVar1;
  lysp_node_notif **notifs;
  lysp_node *node_local;
  
  pplVar1 = lysp_node_notifs_p(node);
  if (pplVar1 == (lysp_node_notif **)0x0) {
    node_local = (lysp_node *)0x0;
  }
  else {
    node_local = (lysp_node *)*pplVar1;
  }
  return (lysp_node_notif *)node_local;
}

Assistant:

lysp_node_notif *
lysp_node_notifs(const struct lysp_node *node)
{
    struct lysp_node_notif **notifs;

    notifs = lysp_node_notifs_p((struct lysp_node *)node);
    if (notifs) {
        return *notifs;
    } else {
        return NULL;
    }
}